

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.h
# Opt level: O2

void __thiscall cmQtAutoGenerator::ProcessResultT::ProcessResultT(ProcessResultT *this)

{
  this->ExitStatus = 0;
  this->TermSignal = 0;
  (this->StdOut)._M_dataplus._M_p = (pointer)&(this->StdOut).field_2;
  (this->StdOut)._M_string_length = 0;
  (this->StdOut).field_2._M_local_buf[0] = '\0';
  (this->StdErr)._M_dataplus._M_p = (pointer)&(this->StdErr).field_2;
  (this->StdErr)._M_string_length = 0;
  (this->StdErr).field_2._M_local_buf[0] = '\0';
  (this->ErrorMessage)._M_dataplus._M_p = (pointer)&(this->ErrorMessage).field_2;
  (this->ErrorMessage)._M_string_length = 0;
  (this->ErrorMessage).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

bool error() const
    {
      return (ExitStatus != 0) || (TermSignal != 0) || !ErrorMessage.empty();
    }